

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O1

HPDF_XrefEntry HPDF_Xref_GetEntryByObjectId(HPDF_Xref xref,HPDF_UINT obj_id)

{
  HPDF_UINT HVar1;
  uint uVar2;
  bool bVar3;
  HPDF_XrefEntry in_RAX;
  HPDF_UINT index;
  HPDF_Xref p_Var4;
  
  p_Var4 = xref;
  do {
    if (p_Var4 == (HPDF_Xref)0x0) {
      return (HPDF_XrefEntry)0x0;
    }
    HVar1 = p_Var4->entries->count;
    uVar2 = p_Var4->start_offset;
    if (obj_id < uVar2 + HVar1) {
      bVar3 = false;
      HPDF_SetError(xref->error,0x1034,0);
      in_RAX = (HPDF_XrefEntry)0x0;
    }
    else {
      if (HVar1 != 0 && uVar2 < obj_id) {
        index = 0;
        do {
          if (obj_id - uVar2 == index) {
            in_RAX = (HPDF_XrefEntry)HPDF_List_ItemAt(p_Var4->entries,index);
            bVar3 = false;
            goto LAB_001362c4;
          }
          index = index + 1;
        } while (HVar1 != index);
      }
      p_Var4 = p_Var4->prev;
      bVar3 = true;
    }
LAB_001362c4:
    if (!bVar3) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

HPDF_XrefEntry
HPDF_Xref_GetEntryByObjectId  (HPDF_Xref  xref,
                               HPDF_UINT  obj_id)
{
    HPDF_Xref tmp_xref = xref;

    HPDF_PTRACE((" HPDF_Xref_GetEntryByObjectId\n"));

    while (tmp_xref) {
        HPDF_UINT i;

        if (tmp_xref->entries->count + tmp_xref->start_offset > obj_id) {
            HPDF_SetError (xref->error, HPDF_INVALID_OBJ_ID, 0);
            return NULL;
        }

        if (tmp_xref->start_offset < obj_id) {
            for (i = 0; i < tmp_xref->entries->count; i++) {
                if (tmp_xref->start_offset + i == obj_id) {
                    HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

                    return entry;
                }
            }
        }

        tmp_xref = tmp_xref->prev;
    }

    return NULL;
}